

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_compareMultiplierStandardUnit_Test::TestBody(Units_compareMultiplierStandardUnit_Test *this)

{
  string *psVar1;
  char cVar2;
  char *pcVar3;
  double dVar4;
  AssertionResult gtest_ar;
  UnitsPtr u2;
  UnitsPtr u1;
  long *local_68;
  long *local_60;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  long local_50 [2];
  AssertHelper local_40 [8];
  string *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  string *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Units::create();
  psVar1 = local_28;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"u1","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  libcellml::Units::addUnit((StandardUnit)local_28,1,1.0,500.0,(string *)0x0);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_38;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"u2","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  pcVar3 = "";
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"","");
  libcellml::Units::addUnit((StandardUnit)local_38,1,1.0,1.0,(string *)0x0);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  dVar4 = (double)libcellml::Units::scalingFactor
                            ((shared_ptr *)&local_28,(shared_ptr *)&local_38,true);
  testing::internal::DoubleNearPredFormat
            ((char *)&local_60,"0.002","libcellml::Units::scalingFactor(u1, u2)",0.002,dVar4,1e-12);
  if (local_60._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_58.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x411,pcVar3);
    testing::internal::AssertHelper::operator=(local_40,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(local_40);
    if (local_68 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_68 != (long *)0x0)) {
        (**(code **)(*local_68 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  dVar4 = (double)libcellml::Units::scalingFactor
                            ((shared_ptr *)&local_38,(shared_ptr *)&local_28,true);
  testing::internal::DoubleNearPredFormat
            ((char *)&local_60,"500.0","libcellml::Units::scalingFactor(u2, u1)",500.0,dVar4,1e-12);
  if (local_60._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x412,pcVar3);
    testing::internal::AssertHelper::operator=(local_40,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(local_40);
    if (local_68 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_68 != (long *)0x0)) {
        (**(code **)(*local_68 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Units, compareMultiplierStandardUnit)
{
    // u1 = 1000*u2
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit(libcellml::Units::StandardUnit::BECQUEREL, 0, 1.0, 500.0);
    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::BECQUEREL, 0, 1.0, 1.0);

    EXPECT_NEAR(0.002, libcellml::Units::scalingFactor(u1, u2), 1e-12);
    EXPECT_NEAR(500.0, libcellml::Units::scalingFactor(u2, u1), 1e-12);
}